

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O2

bool __thiscall ON_ParseSettings::IsDivisionSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  return c == 0xf7 || c == 0x2f;
}

Assistant:

bool ON_ParseSettings::IsDivisionSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case '/':
  case 0x00F7: // unicode divide by symbol
    return true;
    break;
  }

  return false;
}